

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-semaphore.c
# Opt level: O2

int run_test_semaphore_1(void)

{
  uv_sem_t *sem;
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  int64_t eval_b;
  int64_t eval_b_2;
  uv_thread_t thread;
  worker_config_conflict1 wc;
  
  sem = &wc.sem;
  wc.sem._24_8_ = 0;
  wc.delay = 0;
  wc.posted = 0;
  wc.sem._8_8_ = 0;
  wc.sem._16_8_ = 0;
  wc.mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  wc.sem.__align = 0;
  wc.mutex._16_8_ = 0;
  wc.mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  wc.mutex.__align = 0;
  wc.mutex._8_8_ = 0;
  iVar1 = uv_sem_init(sem,0);
  thread = (uv_thread_t)iVar1;
  if (thread == 0) {
    iVar1 = uv_mutex_init(&wc.mutex);
    thread = (uv_thread_t)iVar1;
    if (thread == 0) {
      iVar1 = uv_thread_create(&thread,worker,&wc);
      eval_b = (int64_t)iVar1;
      eval_b_2 = 0;
      if (eval_b == 0) {
        uv_sleep(100);
        uv_mutex_lock(&wc.mutex);
        eval_b = 1;
        eval_b_2 = (int64_t)wc.posted;
        if (eval_b_2 == 1) {
          uv_sem_wait(sem);
          uv_mutex_unlock(&wc.mutex);
          iVar1 = uv_thread_join(&thread);
          eval_b = (int64_t)iVar1;
          eval_b_2 = 0;
          if (eval_b == 0) {
            uv_mutex_destroy(&wc.mutex);
            uv_sem_destroy(sem);
            return 0;
          }
          pcVar3 = "0";
          pcVar2 = "uv_thread_join(&thread)";
          uVar4 = 0x42;
        }
        else {
          pcVar3 = "wc.posted";
          pcVar2 = "1";
          uVar4 = 0x3e;
        }
      }
      else {
        pcVar3 = "0";
        pcVar2 = "uv_thread_create(&thread, worker, &wc)";
        uVar4 = 0x3a;
      }
      goto LAB_0016b0e8;
    }
    pcVar2 = "uv_mutex_init(&wc.mutex)";
    uVar4 = 0x39;
  }
  else {
    pcVar2 = "uv_sem_init(&wc.sem, 0)";
    uVar4 = 0x38;
  }
  pcVar3 = "0";
  eval_b_2 = 0;
  eval_b = thread;
LAB_0016b0e8:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-semaphore.c"
          ,uVar4,pcVar2,"==",pcVar3,eval_b,"==",eval_b_2);
  abort();
}

Assistant:

TEST_IMPL(semaphore_1) {
  uv_thread_t thread;
  worker_config wc;

  memset(&wc, 0, sizeof(wc));

  ASSERT_OK(uv_sem_init(&wc.sem, 0));
  ASSERT_OK(uv_mutex_init(&wc.mutex));
  ASSERT_OK(uv_thread_create(&thread, worker, &wc));

  uv_sleep(100);
  uv_mutex_lock(&wc.mutex);
  ASSERT_EQ(1, wc.posted);
  uv_sem_wait(&wc.sem); /* should not block */
  uv_mutex_unlock(&wc.mutex); /* ergo, it should be ok to unlock after wait */

  ASSERT_OK(uv_thread_join(&thread));
  uv_mutex_destroy(&wc.mutex);
  uv_sem_destroy(&wc.sem);

  return 0;
}